

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Statement * ifStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  int iVar1;
  Expression *pEVar2;
  undefined8 *puVar3;
  Block BVar4;
  Statement local_60;
  
  __return_storage_ptr__->type = STATEMENT_IF;
  (__return_storage_ptr__->field_1).blockStatement.numStatements = (head->value).line;
  (__return_storage_ptr__->field_1).ifStatement.elseBranch.numStatements = 0;
  consume((Token *)&local_60,TOKEN_LEFT_PAREN,
          "Conditionals must start with an openning brace[\'(\'] after If!");
  pEVar2 = expression();
  (__return_storage_ptr__->field_1).ifStatement.condition = pEVar2;
  consume((Token *)&local_60,TOKEN_RIGHT_PAREN,
          "Conditional must end with a closing brace[\')\'] after If!");
  consume((Token *)&local_60,TOKEN_NEWLINE,"Expected newline after If!");
  iVar1 = getNextIndent();
  if (iVar1 == compiler->indentLevel) {
    consumeIndent(iVar1);
    consume((Token *)&local_60,TOKEN_THEN,"Expected Then on the same indent!");
    consume((Token *)&local_60,TOKEN_NEWLINE,"Expected newline after Then!");
  }
  BVar4 = blockStatement(compiler,BLOCK_IF);
  (__return_storage_ptr__->field_1).ifStatement.thenBranch = BVar4;
  consumeIndent(compiler->indentLevel);
  iVar1 = match(TOKEN_ELSE);
  if (iVar1 == 0) {
    consume((Token *)&local_60,TOKEN_ENDIF,"Expected EndIf after If!");
  }
  else {
    iVar1 = match(TOKEN_IF);
    if (iVar1 != 0) {
      ifStatement(&local_60,compiler);
      puVar3 = (undefined8 *)malloc(0x40);
      *puVar3 = local_60._0_8_;
      puVar3[1] = local_60.field_1._0_8_;
      puVar3[2] = local_60.field_1.blockStatement.statements;
      puVar3[3] = local_60.field_1.breakStatement.pos.file;
      puVar3[4] = local_60.field_1.ifStatement.thenBranch.statements;
      puVar3[5] = local_60.field_1._32_8_;
      puVar3[6] = local_60.field_1.ifStatement.elseBranch.statements;
      puVar3[7] = local_60.field_1.routine.code.statements;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x100000001;
      *(undefined8 **)((long)&__return_storage_ptr__->field_1 + 0x28) = puVar3;
      return __return_storage_ptr__;
    }
    consume((Token *)&local_60,TOKEN_NEWLINE,"Expected newline after Else!");
    BVar4 = blockStatement(compiler,BLOCK_ELSE);
    (__return_storage_ptr__->field_1).ifStatement.elseBranch = BVar4;
    consumeIndent(compiler->indentLevel);
    consume((Token *)&local_60,TOKEN_ENDIF,"Expected EndIf after If!");
  }
  consume((Token *)&local_60,TOKEN_NEWLINE,"Expected newline after EndIf!");
  return __return_storage_ptr__;
}

Assistant:

static Statement ifStatement(Compiler *compiler){
    debug("Parsing if statement");
    Statement s;
    s.type = STATEMENT_IF;
    s.ifStatement.line = presentLine();
    s.ifStatement.thenBranch.numStatements = 0;
    s.ifStatement.elseBranch.numStatements = 0;

    consume(TOKEN_LEFT_PAREN, "Conditionals must start with an openning brace['('] after If!");
    s.ifStatement.condition = expression();
    consume(TOKEN_RIGHT_PAREN, "Conditional must end with a closing brace[')'] after If!");
    consume(TOKEN_NEWLINE, "Expected newline after If!");

    if(getNextIndent() == compiler->indentLevel){
        consumeIndent(compiler->indentLevel);
        consume(TOKEN_THEN, "Expected Then on the same indent!");
        consume(TOKEN_NEWLINE, "Expected newline after Then!");
    }

    s.ifStatement.thenBranch = blockStatement(compiler, BLOCK_IF);
    consumeIndent(compiler->indentLevel);

    if(match(TOKEN_ELSE)){
        if(match(TOKEN_IF)){
            Block elseifBlock = {0, BLOCK_ELSE, NULL};
            addToBlock(&elseifBlock, ifStatement(compiler));
            s.ifStatement.elseBranch = elseifBlock;
        }
        else{
            consume(TOKEN_NEWLINE, "Expected newline after Else!");
            s.ifStatement.elseBranch = blockStatement(compiler, BLOCK_ELSE);
            consumeIndent(compiler->indentLevel);
            consume(TOKEN_ENDIF, "Expected EndIf after If!");
            consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
        }
    }
    else{
        consume(TOKEN_ENDIF, "Expected EndIf after If!");
        consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
    }
    debug("If statement parsed");

    return s;
}